

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

hash_code __thiscall
llvm::hashing::detail::hash_combine_recursive_helper::
combine<unsigned_char,unsigned_int,short,llvm::hash_code>
          (hash_combine_recursive_helper *this,size_t length,char *buffer_ptr,char *buffer_end,
          uchar *arg,uint *args,short *args_1,hash_code *args_2)

{
  type_conflict2 data;
  char *buffer_ptr_00;
  hash_code hVar1;
  uint *args_local;
  uchar *arg_local;
  char *buffer_end_local;
  char *buffer_ptr_local;
  size_t length_local;
  hash_combine_recursive_helper *this_local;
  
  buffer_ptr_local = (char *)length;
  length_local = (size_t)this;
  data = get_hashable_data<unsigned_char>(arg);
  buffer_ptr_00 =
       combine_data<unsigned_char>(this,(size_t *)&buffer_ptr_local,buffer_ptr,buffer_end,data);
  hVar1 = combine<unsigned_int,short,llvm::hash_code>
                    (this,(size_t)buffer_ptr_local,buffer_ptr_00,buffer_end,args,args_1,args_2);
  return (hash_code)hVar1.value;
}

Assistant:

hash_code combine(size_t length, char *buffer_ptr, char *buffer_end,
                    const T &arg, const Ts &...args) {
    buffer_ptr = combine_data(length, buffer_ptr, buffer_end, get_hashable_data(arg));

    // Recurse to the next argument.
    return combine(length, buffer_ptr, buffer_end, args...);
  }